

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playGround.cpp
# Opt level: O2

void __thiscall PlayGround::kill_agent(PlayGround *this)

{
  int iVar1;
  bool bVar2;
  reference this_00;
  reference pvVar3;
  Room room;
  Room local_28;
  
  iVar1 = (this->playableworld).agent_location.first;
  this_00 = std::
            vector<std::vector<Room,_std::allocator<Room>_>,_std::allocator<std::vector<Room,_std::allocator<Room>_>_>_>
            ::at(&(this->playableworld).world.boxes,
                 (long)(this->playableworld).agent_location.second - 1);
  pvVar3 = std::vector<Room,_std::allocator<Room>_>::at(this_00,(long)iVar1 - 1);
  local_28.location = pvVar3->location;
  local_28.occupant = pvVar3->occupant;
  local_28.breeze = pvVar3->breeze;
  local_28.stench = pvVar3->stench;
  local_28.glitter = pvVar3->glitter;
  local_28._15_1_ = pvVar3->field_0xf;
  bVar2 = Room::has_wumpus(&local_28);
  if ((!bVar2) && (bVar2 = Room::has_pit(&local_28), !bVar2)) {
    return;
  }
  this->is_agent_dead = true;
  return;
}

Assistant:

void PlayGround::kill_agent()
{
    pair<int, int> agent_location = make_pair(playableworld.agent_location.first - 1, playableworld.agent_location.second - 1);
    Room room = playableworld.world.boxes.at(agent_location.second).at(agent_location.first);
    if (room.has_wumpus() || room.has_pit())
    {
        is_agent_dead = true;
    }
}